

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImBitArray<132,_0>::SetBitRange(ImBitArray<132,_0> *this,int n,int n2)

{
  bool bVar1;
  int n2_local;
  int n_local;
  ImBitArray<132,_0> *this_local;
  
  bVar1 = false;
  if (((-1 < n) && (bVar1 = false, n < 0x84)) && (bVar1 = false, n < n2)) {
    bVar1 = n2 < 0x85;
  }
  if (!bVar1) {
    __assert_fail("n >= 0 && n < BITCOUNT && n2 > n && n2 <= BITCOUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_internal.h"
                  ,0x236,"void ImBitArray<132>::SetBitRange(int, int) [BITCOUNT = 132, OFFSET = 0]")
    ;
  }
  ImBitArraySetBitRange(this->Storage,n,n2);
  return;
}

Assistant:

void            SetBitRange(int n, int n2)  { n += OFFSET; n2 += OFFSET; IM_ASSERT(n >= 0 && n < BITCOUNT && n2 > n && n2 <= BITCOUNT); ImBitArraySetBitRange(Storage, n, n2); }